

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O1

void LoadFunction(LoadState *S,Proto *f,TString *psource)

{
  undefined8 *puVar1;
  byte bVar2;
  int iVar3;
  undefined2 uVar4;
  undefined4 uVar5;
  ulong in_RAX;
  TString *pTVar6;
  Instruction *b;
  TValue *pTVar7;
  Upvaldesc *pUVar8;
  Proto **ppPVar9;
  long lVar10;
  Proto *pPVar11;
  int *b_00;
  LocVar *pLVar12;
  size_t sVar13;
  char *__assertion;
  long lVar14;
  size_t sVar15;
  int x;
  ulong local_38;
  
  local_38 = in_RAX;
  pTVar6 = LoadString(S);
  if (pTVar6 != (TString *)0x0) {
    psource = pTVar6;
  }
  f->source = psource;
  LoadBlock(S,&local_38,4);
  f->linedefined = (int)local_38;
  LoadBlock(S,&local_38,4);
  f->lastlinedefined = (int)local_38;
  LoadBlock(S,&local_38,1);
  f->numparams = (byte)local_38;
  LoadBlock(S,&local_38,1);
  f->is_vararg = (byte)local_38;
  LoadBlock(S,&local_38,1);
  f->maxstacksize = (byte)local_38;
  LoadBlock(S,&local_38,4);
  iVar3 = (int)local_38;
  lVar14 = (long)(int)local_38;
  b = (Instruction *)luaM_realloc_(S->L,(void *)0x0,0,lVar14 << 2);
  f->code = b;
  f->sizecode = iVar3;
  LoadBlock(S,b,lVar14 << 2);
  LoadBlock(S,&local_38,4);
  iVar3 = (int)local_38;
  lVar14 = (long)(int)local_38;
  sVar15 = lVar14 << 4;
  pTVar7 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,sVar15);
  f->k = pTVar7;
  f->sizek = iVar3;
  if (0 < lVar14) {
    sVar13 = 0;
    do {
      *(undefined2 *)((long)&pTVar7->tt_ + sVar13) = 0;
      sVar13 = sVar13 + 0x10;
    } while (sVar15 != sVar13);
    if (0 < iVar3) {
      sVar13 = 0;
      do {
        pTVar7 = f->k;
        LoadBlock(S,&local_38,1);
        switch(local_38 & 0xff) {
        case 0:
          uVar4 = 0;
          break;
        case 1:
          LoadBlock(S,&local_38,1);
          *(uint *)((long)&pTVar7->value_ + sVar13) = (uint)(byte)local_38;
          uVar4 = 1;
          break;
        case 2:
switchD_001243a6_caseD_2:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                        ,0x97,"void LoadConstants(LoadState *, Proto *)");
        case 3:
          LoadBlock(S,&local_38,8);
          *(ulong *)((long)&pTVar7->value_ + sVar13) = local_38;
          uVar4 = 3;
          break;
        case 4:
switchD_001243a6_caseD_4:
          pTVar6 = LoadString(S);
          if (9 < (pTVar6->tt & 0xe)) {
            __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
LAB_001247cd:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                          ,0x94,"void LoadConstants(LoadState *, Proto *)");
          }
          *(TString **)((long)&pTVar7->value_ + sVar13) = pTVar6;
          bVar2 = pTVar6->tt;
          *(ushort *)((long)&pTVar7->tt_ + sVar13) = bVar2 | 0x8000;
          if (((char)bVar2 < '\0') ||
             ((S->L != (lua_State *)0x0 &&
              ((pTVar6->marked & (S->L->l_G->currentwhite ^ 0x18)) != 0)))) {
            __assertion = "0";
            goto LAB_001247cd;
          }
          goto LAB_00124477;
        default:
          if ((byte)local_38 != '\x13') {
            if ((byte)local_38 != '\x14') goto switchD_001243a6_caseD_2;
            goto switchD_001243a6_caseD_4;
          }
          LoadBlock(S,&local_38,8);
          *(ulong *)((long)&pTVar7->value_ + sVar13) = local_38;
          uVar4 = 0x13;
        }
        *(undefined2 *)((long)&pTVar7->tt_ + sVar13) = uVar4;
LAB_00124477:
        sVar13 = sVar13 + 0x10;
      } while (sVar15 != sVar13);
    }
  }
  LoadBlock(S,&local_38,4);
  iVar3 = (int)local_38;
  lVar14 = (long)(int)local_38;
  sVar15 = lVar14 * 0x18;
  pUVar8 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,sVar15);
  f->upvalues = pUVar8;
  f->sizeupvalues = iVar3;
  if (0 < lVar14) {
    sVar13 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pUVar8->name + sVar13);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)&pUVar8->ravi_type_map + sVar13) = 0xffffffff;
      sVar13 = sVar13 + 0x18;
    } while (sVar15 != sVar13);
    if (0 < iVar3) {
      sVar13 = 0;
      do {
        LoadBlock(S,&local_38,1);
        (&f->upvalues->instack)[sVar13] = (byte)local_38;
        LoadBlock(S,&local_38,1);
        (&f->upvalues->idx)[sVar13] = (byte)local_38;
        sVar13 = sVar13 + 0x18;
      } while (sVar15 != sVar13);
    }
  }
  LoadBlock(S,&local_38,4);
  iVar3 = (int)local_38;
  lVar14 = (long)(int)local_38;
  ppPVar9 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,lVar14 * 8);
  f->p = ppPVar9;
  f->sizep = iVar3;
  if (0 < lVar14) {
    lVar10 = 0;
    do {
      f->p[lVar10] = (Proto *)0x0;
      lVar10 = lVar10 + 1;
    } while (lVar14 != lVar10);
  }
  if (0 < iVar3) {
    lVar10 = 0;
    do {
      pPVar11 = luaF_newproto(S->L);
      f->p[lVar10] = pPVar11;
      LoadFunction(S,f->p[lVar10],f->source);
      lVar10 = lVar10 + 1;
    } while (lVar14 != lVar10);
  }
  LoadBlock(S,&local_38,4);
  iVar3 = (int)local_38;
  lVar14 = (long)(int)local_38;
  b_00 = (int *)luaM_realloc_(S->L,(void *)0x0,0,lVar14 << 2);
  f->lineinfo = b_00;
  f->sizelineinfo = iVar3;
  LoadBlock(S,b_00,lVar14 << 2);
  LoadBlock(S,&local_38,4);
  iVar3 = (int)local_38;
  lVar14 = (long)(int)local_38;
  sVar15 = lVar14 << 5;
  pLVar12 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,sVar15);
  f->locvars = pLVar12;
  f->sizelocvars = iVar3;
  if (0 < lVar14) {
    sVar13 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pLVar12->varname + sVar13);
      *puVar1 = 0;
      puVar1[1] = 0;
      sVar13 = sVar13 + 0x20;
    } while (sVar15 != sVar13);
    if (0 < iVar3) {
      sVar13 = 0;
      do {
        pTVar6 = LoadString(S);
        *(TString **)((long)&f->locvars->varname + sVar13) = pTVar6;
        LoadBlock(S,&local_38,4);
        *(int *)((long)&f->locvars->startpc + sVar13) = (int)local_38;
        LoadBlock(S,&local_38,4);
        *(int *)((long)&f->locvars->endpc + sVar13) = (int)local_38;
        if (S->version == '\0') {
          LoadBlock(S,&local_38,1);
          uVar5 = 0xffffffff;
          if ((byte)((byte)local_38 - 1) < 10) {
            uVar5 = *(undefined4 *)(&DAT_001556dc + (ulong)(byte)((byte)local_38 - 1) * 4);
          }
        }
        else {
          LoadBlock(S,&local_38,4);
          uVar5 = (int)local_38;
        }
        *(undefined4 *)((long)&f->locvars->ravi_type_map + sVar13) = uVar5;
        pTVar6 = LoadString(S);
        *(TString **)((long)&f->locvars->usertype + sVar13) = pTVar6;
        sVar13 = sVar13 + 0x20;
      } while (sVar15 != sVar13);
    }
  }
  LoadBlock(S,&local_38,4);
  lVar14 = (long)(int)local_38;
  if (0 < lVar14) {
    lVar10 = 0;
    do {
      pTVar6 = LoadString(S);
      *(TString **)((long)&f->upvalues->name + lVar10) = pTVar6;
      if (S->version == '\0') {
        LoadBlock(S,&local_38,1);
        uVar5 = 0xffffffff;
        if ((byte)((byte)local_38 - 1) < 10) {
          uVar5 = *(undefined4 *)(&DAT_001556dc + (ulong)(byte)((byte)local_38 - 1) * 4);
        }
      }
      else {
        LoadBlock(S,&local_38,4);
        uVar5 = (int)local_38;
      }
      *(undefined4 *)((long)&f->upvalues->ravi_type_map + lVar10) = uVar5;
      pTVar6 = LoadString(S);
      *(TString **)((long)&f->upvalues->usertype + lVar10) = pTVar6;
      lVar10 = lVar10 + 0x18;
    } while (lVar14 * 0x18 != lVar10);
  }
  return;
}

Assistant:

static void LoadFunction (LoadState *S, Proto *f, TString *psource) {
  f->source = LoadString(S);
  if (f->source == NULL)  /* no source in dump? */
    f->source = psource;  /* reuse parent's source */
  f->linedefined = LoadInt(S);
  f->lastlinedefined = LoadInt(S);
  f->numparams = LoadByte(S);
  f->is_vararg = LoadByte(S);
  f->maxstacksize = LoadByte(S);
  LoadCode(S, f);
  LoadConstants(S, f);
  LoadUpvalues(S, f);
  LoadProtos(S, f);
  LoadDebug(S, f);
}